

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::
make_unique<llbuild::basic::DeviceAgnosticFileSystem,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
          (llvm *this,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *args)

{
  DeviceAgnosticFileSystem *this_00;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_20;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *local_18
  ;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  *args_local;
  
  local_18 = args;
  args_local = (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)this;
  this_00 = (DeviceAgnosticFileSystem *)operator_new(0x10);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  unique_ptr(&local_20,local_18);
  llbuild::basic::DeviceAgnosticFileSystem::DeviceAgnosticFileSystem(this_00,&local_20);
  std::
  unique_ptr<llbuild::basic::DeviceAgnosticFileSystem,std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>>
  ::unique_ptr<std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>,void>
            ((unique_ptr<llbuild::basic::DeviceAgnosticFileSystem,std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>>
              *)this,this_00);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr(&local_20);
  return (__uniq_ptr_data<llbuild::basic::DeviceAgnosticFileSystem,_std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::DeviceAgnosticFileSystem,_std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}